

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_uint64_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  ulong uVar1;
  word mask2;
  word mask1;
  uint i;
  word idx;
  uint w;
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  mzd_local_t *A_local;
  mzd_local_t *v_local;
  mzd_local_t *c_local;
  
  w = 2;
  Ablock = A;
  vptr = v->w64;
  for (; w != 0; w = w - 1) {
    idx = *vptr;
    for (i = 0x40; i != 0; i = i - 2) {
      uVar1 = -(idx >> 1 & 1);
      c->w64[0] = Ablock->w64[0] & -(idx & 1) ^ Ablock->w64[2] & uVar1 ^ c->w64[0];
      c->w64[1] = Ablock->w64[1] & -(idx & 1) ^ Ablock->w64[3] & uVar1 ^ c->w64[1];
      idx = idx >> 2;
      Ablock = Ablock + 1;
    }
    vptr = vptr + 1;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 2, idx >>= 2, Ablock += 1) {
      const word mask1 = -(idx & 1);
      const word mask2 = -((idx >> 1) & 1);
      cblock->w64[0] ^= (Ablock->w64[0] & mask1) ^ (Ablock->w64[2] & mask2);
      cblock->w64[1] ^= (Ablock->w64[1] & mask1) ^ (Ablock->w64[3] & mask2);
    }
  }
}